

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterLoadTerm(Fts5Index *p,Fts5SegIter *pIter,int nKeep)

{
  int iVar1;
  u32 local_34;
  u32 local_30;
  int nExtra;
  int nNew;
  int iOff;
  u8 *a;
  Fts5SegIter *pFStack_18;
  int nKeep_local;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  _nNew = pIter->pLeaf->p;
  nExtra = pIter->iLeafOffset;
  a._4_4_ = nKeep;
  pFStack_18 = pIter;
  pIter_local = (Fts5SegIter *)p;
  iVar1 = sqlite3Fts5GetVarint32(_nNew + nExtra,&local_30);
  nExtra = iVar1 + nExtra;
  if (((pFStack_18->pLeaf->szLeaf < (int)(nExtra + local_30)) || ((pFStack_18->term).n < a._4_4_))
     || (local_30 == 0)) {
    pIter_local->iTermLeafOffset = 0x10b;
  }
  else {
    (pFStack_18->term).n = a._4_4_;
    sqlite3Fts5BufferAppendBlob
              (&pIter_local->iTermLeafOffset,&pFStack_18->term,local_30,_nNew + nExtra);
    nExtra = local_30 + nExtra;
    pFStack_18->iTermLeafOffset = nExtra;
    pFStack_18->iTermLeafPgno = pFStack_18->iLeafPgno;
    pFStack_18->iLeafOffset = nExtra;
    if (pFStack_18->iPgidxOff < pFStack_18->pLeaf->nn) {
      iVar1 = sqlite3Fts5GetVarint32(_nNew + pFStack_18->iPgidxOff,&local_34);
      pFStack_18->iPgidxOff = iVar1 + pFStack_18->iPgidxOff;
      pFStack_18->iEndofDoclist = local_34 + pFStack_18->iEndofDoclist;
    }
    else {
      pFStack_18->iEndofDoclist = pFStack_18->pLeaf->nn + 1;
    }
    fts5SegIterLoadRowid((Fts5Index *)pIter_local,pFStack_18);
  }
  return;
}

Assistant:

static void fts5SegIterLoadTerm(Fts5Index *p, Fts5SegIter *pIter, int nKeep){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  int iOff = pIter->iLeafOffset;  /* Offset to read at */
  int nNew;                       /* Bytes of new data */

  iOff += fts5GetVarint32(&a[iOff], nNew);
  if( iOff+nNew>pIter->pLeaf->szLeaf || nKeep>pIter->term.n || nNew==0 ){
    p->rc = FTS5_CORRUPT;
    return;
  }
  pIter->term.n = nKeep;
  fts5BufferAppendBlob(&p->rc, &pIter->term, nNew, &a[iOff]);
  assert( pIter->term.n<=pIter->term.nSpace );
  iOff += nNew;
  pIter->iTermLeafOffset = iOff;
  pIter->iTermLeafPgno = pIter->iLeafPgno;
  pIter->iLeafOffset = iOff;

  if( pIter->iPgidxOff>=pIter->pLeaf->nn ){
    pIter->iEndofDoclist = pIter->pLeaf->nn+1;
  }else{
    int nExtra;
    pIter->iPgidxOff += fts5GetVarint32(&a[pIter->iPgidxOff], nExtra);
    pIter->iEndofDoclist += nExtra;
  }

  fts5SegIterLoadRowid(p, pIter);
}